

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O1

int xSAT_SolverParseDimacs(FILE *pFile,xSAT_Solver_t **p)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  ushort *puVar4;
  int iVar5;
  int iVar6;
  ushort **ppuVar7;
  int *piVar8;
  xSAT_Solver_t *s;
  Vec_Int_t *vLits;
  long lVar9;
  int iVar10;
  char *local_58;
  xSAT_Solver_t **local_50;
  char *local_48;
  ushort **local_40;
  xSAT_Solver_t *local_38;
  
  local_50 = p;
  local_58 = xSAT_FileRead(pFile);
  local_48 = local_58;
  ppuVar7 = __ctype_b_loc();
  vLits = (Vec_Int_t *)0x0;
  s = (xSAT_Solver_t *)0x0;
  local_40 = ppuVar7;
  local_38 = s;
LAB_0054dbfd:
  do {
    puVar4 = *ppuVar7;
    local_58 = local_58 + -1;
    do {
      cVar2 = local_58[1];
      local_58 = local_58 + 1;
    } while ((*(byte *)((long)puVar4 + (long)cVar2 * 2 + 1) & 0x20) != 0);
    if (cVar2 == 'c') {
      do {
        cVar2 = *local_58;
        if (cVar2 == '\0') break;
        local_58 = local_58 + 1;
      } while (cVar2 != '\n');
      goto LAB_0054dbfd;
    }
    if (cVar2 == '\0') {
      if (vLits->pArray != (int *)0x0) {
        free(vLits->pArray);
        vLits->pArray = (int *)0x0;
      }
      if (vLits != (Vec_Int_t *)0x0) {
        free(vLits);
      }
      *local_50 = s;
      iVar6 = xSAT_SolverSimplify(s);
      goto LAB_0054de5d;
    }
    pcVar1 = local_58;
    if (cVar2 == 'p') {
      do {
        local_58 = pcVar1;
        pcVar1 = local_58 + 1;
      } while ((*(byte *)((long)puVar4 + (long)local_58[1] * 2 + 1) & 0x20) != 0);
      do {
        pcVar1 = local_58 + 1;
        local_58 = local_58 + 1;
      } while ((*(byte *)((long)puVar4 + (long)*pcVar1 * 2 + 1) & 0x20) == 0);
      iVar6 = xSAT_ReadInt(&local_58);
      xSAT_ReadInt(&local_58);
      do {
        cVar2 = *local_58;
        if (cVar2 == '\0') break;
        local_58 = local_58 + 1;
      } while (cVar2 != '\n');
      s = xSAT_SolverCreate();
      vLits = (Vec_Int_t *)malloc(0x10);
      if (iVar6 - 1U < 0xf) {
        iVar6 = 0x10;
      }
      vLits->nSize = 0;
      vLits->nCap = iVar6;
      if (iVar6 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc((long)iVar6 << 2);
      }
      vLits->pArray = piVar8;
      local_38 = s;
    }
    else {
      if (s == (xSAT_Solver_t *)0x0) {
        puts("There is no parameter line.");
        exit(1);
      }
      vLits->nSize = 0;
      while (iVar6 = xSAT_ReadInt(&local_58), s = local_38, iVar6 != 0) {
        iVar5 = -iVar6;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        uVar3 = vLits->nCap;
        if (vLits->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vLits->pArray == (int *)0x0) {
              piVar8 = (int *)malloc(0x40);
            }
            else {
              piVar8 = (int *)realloc(vLits->pArray,0x40);
            }
            vLits->pArray = piVar8;
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar3 * 2;
            if (iVar10 <= (int)uVar3) goto LAB_0054dcdc;
            if (vLits->pArray == (int *)0x0) {
              piVar8 = (int *)malloc((ulong)uVar3 << 3);
            }
            else {
              piVar8 = (int *)realloc(vLits->pArray,(ulong)uVar3 << 3);
            }
            vLits->pArray = piVar8;
          }
          if (piVar8 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vLits->nCap = iVar10;
        }
LAB_0054dcdc:
        iVar10 = vLits->nSize;
        vLits->nSize = iVar10 + 1;
        vLits->pArray[iVar10] = (uint)(iVar6 < 1) + iVar5 * 2 + -2;
      }
      iVar6 = xSAT_SolverAddClause(local_38,vLits);
      ppuVar7 = local_40;
      if (iVar6 == 0) {
        iVar6 = 0;
        printf("Vector has %d entries: {",(ulong)(uint)vLits->nSize);
        if (0 < vLits->nSize) {
          lVar9 = 0;
          do {
            printf(" %d",(ulong)(uint)vLits->pArray[lVar9]);
            lVar9 = lVar9 + 1;
          } while (lVar9 < vLits->nSize);
        }
        puts(" }");
LAB_0054de5d:
        if (local_48 != (char *)0x0) {
          free(local_48);
        }
        return iVar6;
      }
    }
  } while( true );
}

Assistant:

int xSAT_SolverParseDimacs( FILE * pFile, xSAT_Solver_t ** p )
{
    char * pText;
    int  Value;
    pText = xSAT_FileRead( pFile );
    Value = xSAT_ParseDimacs( pText, p );
    ABC_FREE( pText );
    return Value;
}